

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  long lVar2;
  initializer_list<Data::Parameter> __l;
  html serializer;
  Data data;
  Sample_t<kiste::terminal_t,_Data,_kiste::html> sample;
  undefined8 *local_1f0;
  undefined1 local_1e8 [32];
  long *local_1c8;
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [2];
  long *local_188 [2];
  long local_178 [2];
  vector<Data::Parameter,_std::allocator<Data::Parameter>_> local_168;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  char local_120 [16];
  _Alloc_hider local_110;
  char local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"Less <, Greater >, And &, Quot \", Tick \'","");
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"#ddd","");
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"https://www.test.com/?kiste=easy&cheesecake=yammi","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"somewhere","");
  local_150._0_8_ = local_150 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"HIDDEN","");
  local_130._M_p = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"SECRET","");
  local_110._M_p = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Shhhh!","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"TEXT","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"SUBMIT","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"submit","");
  plVar1 = local_40;
  local_50[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Submit","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_150;
  std::vector<Data::Parameter,_std::allocator<Data::Parameter>_>::vector
            (&local_168,__l,(allocator_type *)&local_1f0);
  lVar2 = -0x120;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    if (plVar1 + -4 != (long *)plVar1[-6]) {
      operator_delete((long *)plVar1[-6],plVar1[-4] + 1);
    }
    if (plVar1 + -8 != (long *)plVar1[-10]) {
      operator_delete((long *)plVar1[-10],plVar1[-8] + 1);
    }
    plVar1 = plVar1 + -0xc;
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0);
  local_1f0 = &std::cout;
  local_150._0_8_ = &kiste::terminal;
  local_150._8_8_ = (_data_t *)local_1e8;
  local_150._16_8_ = (allocator_type *)&local_1f0;
  test::Sample_t<kiste::terminal_t,_Data,_kiste::html>::render
            ((Sample_t<kiste::terminal_t,_Data,_kiste::html> *)local_150);
  std::vector<Data::Parameter,_std::allocator<Data::Parameter>_>::~vector(&local_168);
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  return 0;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = kiste::html{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
}